

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O2

void CZopfliPNGSetDefaults(CZopfliPNGOptions *png_options)

{
  ZopfliPNGOptions opts;
  
  png_options->num_iterations = 0;
  png_options->num_iterations_large = 0;
  *(undefined8 *)&png_options->block_split_strategy = 0;
  png_options->keepchunks = (char **)0x0;
  png_options->num_keepchunks = 0;
  png_options->use_zopfli = 0;
  png_options->filter_strategies = (ZopfliPNGFilterStrategy *)0x0;
  png_options->num_filter_strategies = 0;
  png_options->auto_filter_strategy = 0;
  opts.verbose = false;
  opts.lossy_transparent = false;
  opts.lossy_8bit = false;
  opts.filter_strategies.
  super__Vector_base<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.filter_strategies.
  super__Vector_base<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.filter_strategies.
  super__Vector_base<ZopfliPNGFilterStrategy,_std::allocator<ZopfliPNGFilterStrategy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.auto_filter_strategy = true;
  opts.keep_colortype = false;
  opts.keepchunks.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  opts.keepchunks.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.keepchunks.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.use_zopfli = true;
  opts.num_iterations = 0xf;
  opts.num_iterations_large = 5;
  opts.block_split_strategy = 1;
  png_options->lossy_transparent = 0;
  png_options->lossy_8bit = 0;
  png_options->auto_filter_strategy = 1;
  png_options->use_zopfli = 1;
  png_options->num_iterations = 0xf;
  png_options->num_iterations_large = 5;
  png_options->block_split_strategy = 1;
  ZopfliPNGOptions::~ZopfliPNGOptions(&opts);
  return;
}

Assistant:

void CZopfliPNGSetDefaults(CZopfliPNGOptions* png_options) {

  memset(png_options, 0, sizeof(*png_options));
  // Constructor sets the defaults
  ZopfliPNGOptions opts;

  png_options->lossy_transparent    = opts.lossy_transparent;
  png_options->lossy_8bit           = opts.lossy_8bit;
  png_options->auto_filter_strategy = opts.auto_filter_strategy;
  png_options->use_zopfli           = opts.use_zopfli;
  png_options->num_iterations       = opts.num_iterations;
  png_options->num_iterations_large = opts.num_iterations_large;
  png_options->block_split_strategy = opts.block_split_strategy;
}